

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateNoClear(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int p_col,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *p_work,int *p_idx,int num)

{
  uint *puVar1;
  uint uVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  long lVar10;
  byte bVar11;
  int p_row;
  int *piVar12;
  fpclass_type *pfVar13;
  int32_t *piVar14;
  cpp_dec_float<50U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_158;
  ulong local_118;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_110;
  cpp_dec_float<50U,_int,_void> local_108;
  cpp_dec_float<50U,_int,_void> *local_c8;
  pointer local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  int *local_88;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  uint *local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_98 = 0;
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems._24_5_ = 0;
  local_108.data._M_elems[7]._1_3_ = 0;
  local_108.data._M_elems._32_5_ = 0;
  local_108.data._M_elems[9]._1_3_ = 0;
  local_108.exp = 0;
  local_108.neg = false;
  local_118 = (ulong)p_col;
  pcVar9 = &p_work[local_118].m_backend;
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  local_80 = p_idx;
  local_78 = p_work;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_158,1,(type *)0x0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_68,&local_158,pcVar9);
  local_108.data._M_elems[0] = local_68.data._M_elems[0];
  local_108.data._M_elems[1] = local_68.data._M_elems[1];
  local_108.data._M_elems[2] = local_68.data._M_elems[2];
  local_108.data._M_elems[3] = local_68.data._M_elems[3];
  local_108.data._M_elems[4] = local_68.data._M_elems[4];
  local_108.data._M_elems[5] = local_68.data._M_elems[5];
  local_108.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
  local_108.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
  local_108.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
  local_108.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
  local_108.exp = local_68.exp;
  local_108.neg = local_68.neg;
  local_108.fpclass = local_68.fpclass;
  local_108.prec_elem = local_68.prec_elem;
  p_row = (int)local_118;
  iVar5 = makeLvec(this,num,p_row);
  piVar8 = local_80;
  local_c0 = (this->l).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (this->l).idx;
  iVar6 = local_80[(long)num + -1];
  local_110 = this;
  if (iVar6 != p_row) {
    local_c8 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(local_c8._4_4_,iVar5);
    piVar12 = local_88 + iVar5;
    pfVar13 = &local_c0[iVar5].m_backend.fpclass;
    lVar7 = 0;
    local_118 = (ulong)(uint)num;
    do {
      *piVar12 = iVar6;
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      pcVar9 = &local_108;
      if (&local_158 != &local_78[iVar6].m_backend) {
        local_158.data._M_elems[8] = local_108.data._M_elems[8];
        local_158.data._M_elems[9] =
             (uint)(CONCAT35(local_108.data._M_elems[9]._1_3_,local_108.data._M_elems._32_5_) >>
                   0x20);
        local_158.data._M_elems[4] = local_108.data._M_elems[4];
        local_158.data._M_elems[5] = local_108.data._M_elems[5];
        local_158.data._M_elems[6] = local_108.data._M_elems[6];
        local_158.data._M_elems[7] =
             (uint)(CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_) >>
                   0x20);
        local_158.data._M_elems[0] = local_108.data._M_elems[0];
        local_158.data._M_elems[1] = local_108.data._M_elems[1];
        local_158.data._M_elems[2] = local_108.data._M_elems[2];
        local_158.data._M_elems[3] = local_108.data._M_elems[3];
        local_158.exp = local_108.exp;
        local_158.neg = local_108.neg;
        local_158.fpclass = local_108.fpclass;
        local_158.prec_elem = local_108.prec_elem;
        pcVar9 = &local_78[iVar6].m_backend;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_158,pcVar9);
      *(ulong *)(((cpp_dec_float<50U,_int,_void> *)(pfVar13 + -0xc))->data)._M_elems =
           CONCAT44(local_158.data._M_elems[1],local_158.data._M_elems[0]);
      *(ulong *)(pfVar13 + -10) = CONCAT44(local_158.data._M_elems[3],local_158.data._M_elems[2]);
      *(ulong *)(pfVar13 + -8) = CONCAT44(local_158.data._M_elems[5],local_158.data._M_elems[4]);
      *(ulong *)(pfVar13 + -6) = CONCAT44(local_158.data._M_elems[7],local_158.data._M_elems[6]);
      *(ulong *)(pfVar13 + -4) = CONCAT44(local_158.data._M_elems[9],local_158.data._M_elems[8]);
      pfVar13[-2] = local_158.exp;
      *(bool *)(pfVar13 + -1) = local_158.neg;
      *(undefined8 *)pfVar13 = local_158._48_8_;
      iVar6 = piVar8[(long)(num + -1) + lVar7 + -1];
      piVar12 = piVar12 + 1;
      pfVar13 = pfVar13 + 0xe;
      lVar7 = lVar7 + -1;
    } while (iVar6 != p_col);
    iVar5 = (int)local_c8 - (int)lVar7;
    num = (int)local_118 + (int)lVar7;
  }
  lVar7 = (long)iVar5;
  local_88[lVar7] = p_col;
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_158,1,(type *)0x0);
  local_68.data._M_elems._32_5_ = local_108.data._M_elems._32_5_;
  local_68.data._M_elems[9]._1_3_ = local_108.data._M_elems[9]._1_3_;
  local_68.data._M_elems[4] = local_108.data._M_elems[4];
  local_68.data._M_elems[5] = local_108.data._M_elems[5];
  local_68.data._M_elems._24_5_ = local_108.data._M_elems._24_5_;
  local_68.data._M_elems[7]._1_3_ = local_108.data._M_elems[7]._1_3_;
  local_68.data._M_elems[0] = local_108.data._M_elems[0];
  local_68.data._M_elems[1] = local_108.data._M_elems[1];
  local_68.data._M_elems[2] = local_108.data._M_elems[2];
  local_68.data._M_elems[3] = local_108.data._M_elems[3];
  local_68.exp = local_108.exp;
  local_68.neg = local_108.neg;
  local_68.fpclass = local_108.fpclass;
  local_68.prec_elem = local_108.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_68,&local_158);
  if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
    local_68.neg = (bool)(local_68.neg ^ 1);
  }
  *(ulong *)((long)local_c0[lVar7].m_backend.data._M_elems + 0x20) =
       CONCAT35(local_68.data._M_elems[9]._1_3_,local_68.data._M_elems._32_5_);
  puVar1 = (uint *)((long)local_c0[lVar7].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = local_68.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_68.data._M_elems[7]._1_3_,local_68.data._M_elems._24_5_);
  *(undefined8 *)local_c0[lVar7].m_backend.data._M_elems = local_68.data._M_elems._0_8_;
  *(undefined8 *)((long)local_c0[lVar7].m_backend.data._M_elems + 8) = local_68.data._M_elems._8_8_;
  local_c0[lVar7].m_backend.exp = local_68.exp;
  local_c0[lVar7].m_backend.neg = local_68.neg;
  local_c0[lVar7].m_backend.fpclass = local_68.fpclass;
  local_c0[lVar7].m_backend.prec_elem = local_68.prec_elem;
  if (1 < num) {
    local_c8 = &(local_110->maxabs).m_backend;
    local_70 = (local_110->maxabs).m_backend.data._M_elems + 1;
    lVar10 = (ulong)(num - 2) + 1;
    piVar8 = local_88 + lVar7;
    piVar14 = &local_c0[lVar7 + 1].m_backend.prec_elem;
    do {
      piVar8 = piVar8 + 1;
      iVar6 = local_80[lVar10 + -1];
      *piVar8 = iVar6;
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.exp = 0;
      local_158.neg = false;
      pcVar9 = &local_108;
      if (&local_158 != &local_78[iVar6].m_backend) {
        local_158.data._M_elems[8] = local_108.data._M_elems[8];
        local_158.data._M_elems[9] =
             (uint)(CONCAT35(local_108.data._M_elems[9]._1_3_,local_108.data._M_elems._32_5_) >>
                   0x20);
        local_158.data._M_elems[4] = local_108.data._M_elems[4];
        local_158.data._M_elems[5] = local_108.data._M_elems[5];
        local_158.data._M_elems[6] = local_108.data._M_elems[6];
        local_158.data._M_elems[7] =
             (uint)(CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_) >>
                   0x20);
        local_158.data._M_elems[0] = local_108.data._M_elems[0];
        local_158.data._M_elems[1] = local_108.data._M_elems[1];
        local_158.data._M_elems[2] = local_108.data._M_elems[2];
        local_158.data._M_elems[3] = local_108.data._M_elems[3];
        local_158.exp = local_108.exp;
        local_158.neg = local_108.neg;
        local_158.fpclass = local_108.fpclass;
        local_158.prec_elem = local_108.prec_elem;
        pcVar9 = &local_78[iVar6].m_backend;
      }
      local_118 = lVar10;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_158,pcVar9);
      bVar11 = local_158.neg;
      uVar2 = local_158.data._M_elems[0];
      local_b8 = CONCAT44(local_158.data._M_elems[2],local_158.data._M_elems[1]);
      uStack_b0 = CONCAT44(local_158.data._M_elems[4],local_158.data._M_elems[3]);
      local_a8 = CONCAT44(local_158.data._M_elems[6],local_158.data._M_elems[5]);
      uStack_a0 = CONCAT44(local_158.data._M_elems[8],local_158.data._M_elems[7]);
      local_98 = local_158.data._M_elems[9];
      fVar3 = local_158.fpclass;
      iVar4 = local_158.prec_elem;
      (((cpp_dec_float<50U,_int,_void> *)(piVar14 + -0xd))->data)._M_elems[0] =
           local_158.data._M_elems[0];
      piVar14[-4] = local_158.data._M_elems[9];
      *(undefined8 *)(piVar14 + -8) = local_a8;
      *(undefined8 *)(piVar14 + -6) = uStack_a0;
      *(undefined8 *)(piVar14 + -0xc) = local_b8;
      *(undefined8 *)(piVar14 + -10) = uStack_b0;
      piVar14[-3] = local_158.exp;
      *(bool *)(piVar14 + -2) = local_158.neg;
      piVar14[-1] = local_158.fpclass;
      *piVar14 = local_158.prec_elem;
      if ((local_158.neg == true) &&
         (local_158.fpclass != cpp_dec_float_finite || local_158.data._M_elems[0] != 0)) {
        local_158.neg = false;
      }
      if ((local_158.fpclass != cpp_dec_float_NaN) &&
         ((local_110->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) {
        local_c0 = (pointer)CONCAT44(local_c0._4_4_,local_158.exp);
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_158,local_c8);
        if (0 < iVar6) {
          if ((bool)bVar11 != false) {
            bVar11 = bVar11 ^ (fVar3 != cpp_dec_float_finite || uVar2 != 0);
          }
          (local_110->maxabs).m_backend.data._M_elems[0] = uVar2;
          local_70[8] = local_98;
          *(undefined8 *)(local_70 + 4) = local_a8;
          *(undefined8 *)(local_70 + 6) = uStack_a0;
          *(undefined8 *)local_70 = local_b8;
          *(undefined8 *)(local_70 + 2) = uStack_b0;
          (local_110->maxabs).m_backend.exp = (int)local_c0;
          (local_110->maxabs).m_backend.neg = (bool)bVar11;
          (local_110->maxabs).m_backend.fpclass = fVar3;
          (local_110->maxabs).m_backend.prec_elem = iVar4;
        }
      }
      piVar14 = piVar14 + 0xe;
      lVar10 = local_118 + -1;
    } while (lVar10 != 0 && 0 < (long)local_118);
  }
  local_110->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::updateNoClear(
   int p_col,
   const R* p_work,
   const int* p_idx,
   int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   ll = makeLvec(num, p_col);
   //ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}